

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

int minTemp3_fast(word *pInOut,int iVar,int start,int finish,int iQ,int jQ,int *pDifStart)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  bVar1 = (byte)iVar;
  if (finish <= start) {
    iVar2 = jQ << (bVar1 & 0x1f);
    if (0x3f < iVar2) {
      __assert_fail("jQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckyFast16.c"
                    ,0xd3,"int minTemp3_fast(word *, int, int, int, int, int, int *)");
    }
    iVar3 = start * 100 + 0x14;
    lVar5 = (long)start + 1;
    do {
      uVar4 = (SFmask[iVar][iQ] & pInOut[lVar5 + -1]) << ((byte)(iQ << (bVar1 & 0x1f)) & 0x3f);
      uVar6 = (pInOut[lVar5 + -1] & SFmask[iVar][jQ]) << ((byte)iVar2 & 0x3f);
      if (uVar4 != uVar6) {
        iVar2 = firstShiftWithOneBit(uVar6 ^ uVar4,1 << (bVar1 & 0x1f));
        *pDifStart = iVar3 - iVar2;
        return (uint)(uVar6 < uVar4);
      }
      iVar3 = iVar3 + -100;
      lVar5 = lVar5 + -1;
    } while (finish < lVar5);
  }
  *pDifStart = 0;
  return 0;
}

Assistant:

int minTemp3_fast(word* pInOut, int iVar, int start, int finish, int iQ, int jQ, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=start; i>=finish; i--)
    {
        assert( jQ*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) ^ ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) <= ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize)) )
                return 0;
            else
                return 1;
        }
    }
    *pDifStart=0;
    return 0;
}